

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::addItem(QBoxLayout *this,QLayoutItem *item)

{
  QBoxLayoutItem *this_00;
  QLayoutItem *in_RSI;
  long *in_RDI;
  QBoxLayoutItem *it;
  QBoxLayoutPrivate *d;
  parameter_type in_stack_ffffffffffffffc8;
  
  d_func((QBoxLayout *)0x2f5221);
  this_00 = (QBoxLayoutItem *)operator_new(0x10);
  QBoxLayoutItem::QBoxLayoutItem(this_00,in_RSI,0);
  QList<QBoxLayoutItem_*>::append((QList<QBoxLayoutItem_*> *)0x2f5264,in_stack_ffffffffffffffc8);
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QBoxLayout::addItem(QLayoutItem *item)
{
    Q_D(QBoxLayout);
    QBoxLayoutItem *it = new QBoxLayoutItem(item);
    d->list.append(it);
    invalidate();
}